

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void set_baseline_gf_interval(AV1_COMP *cpi,FRAME_TYPE frame_type)

{
  AV1_PRIMARY *pAVar1;
  AV1_PRIMARY *pAVar2;
  LAYER_CONTEXT *pLVar3;
  FRAME_UPDATE_TYPE FVar4;
  char in_SIL;
  AV1_COMP *in_RDI;
  LAYER_CONTEXT *lc;
  int layer;
  SVC *svc;
  GF_GROUP *gf_group;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  byte local_41;
  int local_34;
  
  pAVar1 = in_RDI->ppi;
  pAVar2 = in_RDI->ppi;
  set_golden_update(in_RDI);
  if (((in_RDI->rc).frames_to_key < (pAVar1->p_rc).baseline_gf_interval) &&
     (((in_RDI->oxcf).kf_cfg.auto_key & 1U) != 0)) {
    (pAVar1->p_rc).baseline_gf_interval = (in_RDI->rc).frames_to_key;
  }
  (pAVar1->p_rc).gfu_boost = 2000;
  local_41 = 0;
  if ((in_RDI->rc).frames_to_key <= (pAVar1->p_rc).baseline_gf_interval) {
    local_41 = (in_RDI->oxcf).kf_cfg.auto_key;
  }
  (pAVar1->p_rc).constrained_gf_group = (uint)((local_41 & 1) != 0);
  (in_RDI->rc).frames_till_gf_update_due = (pAVar1->p_rc).baseline_gf_interval;
  in_RDI->gf_frame_index = '\0';
  if (in_RDI->ppi->use_svc != 0) {
    (pAVar1->p_rc).baseline_gf_interval = 0xf9;
    (pAVar1->p_rc).gfu_boost = 1;
    (pAVar1->p_rc).constrained_gf_group = 0;
    (in_RDI->rc).frames_till_gf_update_due = (pAVar1->p_rc).baseline_gf_interval;
    for (local_34 = 0;
        local_34 < (in_RDI->svc).number_spatial_layers * (in_RDI->svc).number_temporal_layers;
        local_34 = local_34 + 1) {
      pLVar3 = (in_RDI->svc).layer_context;
      pLVar3[local_34].p_rc.baseline_gf_interval = (pAVar1->p_rc).baseline_gf_interval;
      pLVar3[local_34].p_rc.gfu_boost = (pAVar1->p_rc).gfu_boost;
      pLVar3[local_34].p_rc.constrained_gf_group = (pAVar1->p_rc).constrained_gf_group;
      pLVar3[local_34].rc.frames_till_gf_update_due = (in_RDI->rc).frames_till_gf_update_due;
      pLVar3[local_34].group_index = '\0';
    }
  }
  (pAVar2->gf_group).size = (pAVar1->p_rc).baseline_gf_interval;
  FVar4 = '\x02';
  if (in_SIL == '\0') {
    FVar4 = '\0';
  }
  (pAVar2->gf_group).update_type[0] = FVar4;
  (pAVar2->gf_group).refbuf_state[in_RDI->gf_frame_index] = in_SIL != '\0';
  return;
}

Assistant:

static void set_baseline_gf_interval(AV1_COMP *cpi, FRAME_TYPE frame_type) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  set_golden_update(cpi);

  if (p_rc->baseline_gf_interval > rc->frames_to_key &&
      cpi->oxcf.kf_cfg.auto_key)
    p_rc->baseline_gf_interval = rc->frames_to_key;
  p_rc->gfu_boost = DEFAULT_GF_BOOST_RT;
  p_rc->constrained_gf_group =
      (p_rc->baseline_gf_interval >= rc->frames_to_key &&
       cpi->oxcf.kf_cfg.auto_key)
          ? 1
          : 0;
  rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
  cpi->gf_frame_index = 0;
  // SVC does not use GF as periodic boost.
  // TODO(marpan): Find better way to disable this for SVC.
  if (cpi->ppi->use_svc) {
    SVC *const svc = &cpi->svc;
    p_rc->baseline_gf_interval = MAX_STATIC_GF_GROUP_LENGTH - 1;
    p_rc->gfu_boost = 1;
    p_rc->constrained_gf_group = 0;
    rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
    for (int layer = 0;
         layer < svc->number_spatial_layers * svc->number_temporal_layers;
         ++layer) {
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      lc->p_rc.baseline_gf_interval = p_rc->baseline_gf_interval;
      lc->p_rc.gfu_boost = p_rc->gfu_boost;
      lc->p_rc.constrained_gf_group = p_rc->constrained_gf_group;
      lc->rc.frames_till_gf_update_due = rc->frames_till_gf_update_due;
      lc->group_index = 0;
    }
  }
  gf_group->size = p_rc->baseline_gf_interval;
  gf_group->update_type[0] = (frame_type == KEY_FRAME) ? KF_UPDATE : GF_UPDATE;
  gf_group->refbuf_state[cpi->gf_frame_index] =
      (frame_type == KEY_FRAME) ? REFBUF_RESET : REFBUF_UPDATE;
}